

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O2

void __thiscall FloatingDisplay::layoutWidgets(FloatingDisplay *this,int targetWidth)

{
  int iVar1;
  QSize *pQVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int h;
  int w;
  
  iVar1 = this->baseWindowWidth;
  if (targetWidth < iVar1 / 2) {
    targetWidth = iVar1 / 2;
  }
  if (SBORROW4(targetWidth,iVar1 * 8) == targetWidth + iVar1 * -8 < 0) {
    targetWidth = iVar1 * 8;
  }
  pQVar2 = (QSize *)this->midiMessageLED;
  operator*(&MIDI_MESSAGE_LED_SIZE,(double)targetWidth / (double)iVar1);
  QWidget::resize(pQVar2);
  iVar4 = QFrame::frameWidth();
  lVar3 = *(long *)&(this->midiMessageLED->super_LEDWidget).field_0x20;
  iVar1 = *(int *)(lVar3 + 0x14);
  iVar5 = targetWidth - (iVar4 * 2 + 4 + *(int *)(lVar3 + 0x1c));
  w = iVar1 + iVar5 + -5;
  h = (**(code **)(*(long *)this->lcdWidget + 0x80))(this->lcdWidget,w);
  QWidget::resize(&this->lcdWidget->super_QWidget,w,h);
  lVar3 = *(long *)((QWidget *)this->midiMessageLED + 0x20);
  QWidget::move((QWidget *)this->midiMessageLED,iVar4 + 1 + iVar5 + iVar1,
                (int)(~*(uint *)(lVar3 + 0x20) + h + *(int *)(lVar3 + 0x18)) / 2 + iVar4 + 2);
  QWidget::move(this->sizeGrip,targetWidth + -10,h + iVar4 * 2 + -6);
  QWidget::resize((QWidget *)this,targetWidth,h + iVar4 * 2 + 4);
  return;
}

Assistant:

void FloatingDisplay::layoutWidgets(int targetWidth) {
	targetWidth = qMin(qMax(targetWidth, baseWindowWidth / 2), 8 * baseWindowWidth);

	qreal scale = targetWidth / qreal(baseWindowWidth);
	midiMessageLED->resize(MIDI_MESSAGE_LED_SIZE * scale);

	int frameWithMargin = frameWidth() + CONTENT_MARGIN;
	int lcdWidth = targetWidth - (midiMessageLED->width() + 2 * frameWithMargin + LAYOUT_SPACING);
	int lcdHeight = lcdWidget->heightForWidth(lcdWidth);
	lcdWidget->resize(lcdWidth, lcdHeight);
	int targetHeight = lcdHeight + 2 * frameWithMargin;

	midiMessageLED->move(frameWithMargin + lcdWidth + LAYOUT_SPACING, frameWithMargin + (lcdHeight - midiMessageLED->height()) / 2);

	sizeGrip->move(targetWidth - SIZE_GRIP_SIZE.width(), targetHeight - SIZE_GRIP_SIZE.height());

	resize(targetWidth, targetHeight);
}